

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

void __thiscall CRegexParser::~CRegexParser(CRegexParser *this)

{
  reset(this);
  if (this->tuple_arr_ != (re_tuple_conflict *)0x0) {
    free(this->tuple_arr_);
    this->tuple_arr_ = (re_tuple_conflict *)0x0;
  }
  if (this->range_buf_ != (wchar_t *)0x0) {
    free(this->range_buf_);
    this->range_buf_ = (wchar_t *)0x0;
  }
  return;
}

Assistant:

CRegexParser::~CRegexParser()
{
    /* reset state (to delete most of our memory structures) */
    reset();
    
    /* if we've allocated an array, delete it */
    if (tuple_arr_ != 0)
    {
        t3free(tuple_arr_);
        tuple_arr_ = 0;
    }

    /* delete our range buffer if we have one */
    if (range_buf_ != 0)
    {
        t3free(range_buf_);
        range_buf_ = 0;
    }
}